

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O0

_Bool borg_wear_stuff(void)

{
  bool bVar1;
  bool bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  uint32_t uVar7;
  borg_item_conflict *pbVar8;
  char *pcVar9;
  _Bool fix;
  borg_item_conflict *item;
  char target_ring_desc [80];
  int local_38;
  int danger;
  int b_ii;
  int ii;
  int b_i;
  int i;
  int32_t b_p;
  int32_t p;
  _Bool recently_worn;
  int o;
  int d;
  int slot;
  int hole;
  
  b_ii = -1;
  local_38 = -1;
  bVar2 = false;
  b_i = borg.power;
  if ((borg.trait[0x6d] == 0) && (borg.trait[0x6c] == 0)) {
    wVar3 = borg_first_empty_inventory_slot();
    if (wVar3 == L'\xffffffff') {
      slot._3_1_ = false;
    }
    else if (borg_t - borg_began < 0x7d1) {
      if (borg.time_this_panel < 0x515) {
        for (ii = 0; ii < (int)(uint)z_info->pack_size; ii = ii + 1) {
          pbVar8 = borg_items + ii;
          bVar1 = false;
          if ((((pbVar8->iqty != '\0') && ((pbVar8->aware & 1U) != 0)) && (pbVar8->value != 0)) &&
             (((((player->opts).opt[0x1e] & 1U) == 0 || (pbVar8->art_idx == '\0')) ||
              ((pbVar8->ident & 1U) != 0)))) {
            for (p = 0; p < track_worn_num; p = p + 1) {
              if (((0 < track_worn_num) && (track_worn_name1[p] == pbVar8->art_idx)) &&
                 (borg_t + -10 < (int)track_worn_time)) {
                bVar1 = true;
              }
            }
            if (bVar1) {
              pcVar9 = format("# Not considering a %s; it was recently worn.",pbVar8);
              borg_note(pcVar9);
            }
            else {
              wVar4 = borg_wield_slot(pbVar8);
              if ((L'\xffffffff' < wVar4) &&
                 ((borg.trait[0x7a] == 0 || (borg_items[wVar4].modifiers[0] <= pbVar8->modifiers[0])
                  ))) {
                wVar5 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
                if ((wVar4 != (uint)z_info->pack_size + L'\x03') ||
                   ((borg_items[(int)(z_info->pack_size + 3)].iqty == '\0' ||
                    (borg_items[(int)(z_info->pack_size + 2)].iqty == '\0')))) {
                  memcpy(borg_items + wVar3,safe_items + wVar4,0x388);
                  memcpy(borg_items + wVar4,safe_items + ii,0x388);
                  borg_items[wVar4].iqty = '\x01';
                  borg_items[ii].iqty = borg_items[ii].iqty + 0xff;
                  bVar2 = true;
                  borg_notice(true);
                  i = borg_power();
                  wVar6 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
                  memcpy(borg_items + wVar4,safe_items + wVar4,0x388);
                  memcpy(borg_items + ii,safe_items + ii,0x388);
                  borg_items[wVar3].iqty = '\0';
                  if (((pbVar8->one_ring & 1U) != 0) &&
                     (borg_items[(int)(z_info->pack_size + 3)].tval == '\0')) {
                    i = -99999;
                  }
                  if ((wVar5 < wVar6) || (i <= b_i + 0x32)) goto LAB_002b79a6;
                  b_ii = ii;
                  b_i = i;
                }
                uVar7 = Rand_div(100);
                if ((((uVar7 == 10) || ((pbVar8->one_ring & 1U) != 0)) &&
                    (wVar4 == (uint)z_info->pack_size + L'\x03')) &&
                   ((borg_items[(int)(z_info->pack_size + 3)].iqty != '\0' &&
                    (borg_items[(int)(z_info->pack_size + 2)].iqty != '\0')))) {
                  for (danger = z_info->pack_size + 2; danger <= (int)(z_info->pack_size + 3);
                      danger = danger + 1) {
                    memcpy(borg_items + wVar3,safe_items + danger,0x388);
                    memcpy(borg_items + danger,safe_items + ii,0x388);
                    borg_items[danger].iqty = '\x01';
                    borg_items[ii].iqty = borg_items[ii].iqty + 0xff;
                    bVar2 = true;
                    borg_notice(true);
                    i = borg_power();
                    wVar4 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
                    memcpy(borg_items + danger,safe_items + danger,0x388);
                    memcpy(borg_items + ii,safe_items + ii,0x388);
                    borg_items[wVar3].iqty = '\0';
                    if ((danger == z_info->pack_size + 3) && ((pbVar8->one_ring & 1U) != 0)) {
                      i = -99999;
                    }
                    if ((b_i <= i) && ((wVar4 < wVar5 || (wVar5 == L'\0')))) {
                      b_ii = ii;
                      b_i = i;
                      local_38 = danger;
                    }
                  }
                }
              }
            }
          }
LAB_002b79a6:
        }
        if (bVar2) {
          borg_notice(true);
        }
        if ((b_ii < 0) || (b_i <= borg.power)) {
          slot._3_1_ = false;
        }
        else {
          pbVar8 = borg_items + b_ii;
          my_strcpy((char *)&item,pbVar8->desc,0x50);
          if ((local_38 < (int)(z_info->pack_size + 2)) || (pbVar8->tval != '\x15')) {
            pcVar9 = format("# Wearing %s.",pbVar8);
            borg_note(pcVar9);
            borg_keypress(0x77);
            borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[b_ii]);
            borg.time_this_panel = borg.time_this_panel + 1;
            if ((pbVar8->art_idx != '\0') && (track_worn_num < track_worn_size)) {
              borg_note("# Noting the wearing of artifact.");
              track_worn_name1[track_worn_num] = pbVar8->art_idx;
              track_worn_time = borg_t;
              track_worn_num = track_worn_num + 1;
            }
            slot._3_1_ = true;
          }
          else {
            pcVar9 = format("# Removing %s to make room for %s.",borg_items + local_38,pbVar8);
            borg_note(pcVar9);
            borg_keypress(0x74);
            borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                               [(int)(local_38 - (uint)z_info->pack_size)]);
            borg.time_this_panel = borg.time_this_panel + 1;
            slot._3_1_ = true;
          }
        }
      }
      else {
        slot._3_1_ = false;
      }
    }
    else {
      slot._3_1_ = false;
    }
  }
  else {
    slot._3_1_ = false;
  }
  return slot._3_1_;
}

Assistant:

bool borg_wear_stuff(void)
{
    int hole = 0;

    int  slot;
    int  d;
    int  o;
    bool recently_worn = false;

    int32_t p, b_p = 0L;

    int i, b_i     = -1;
    int ii, b_ii   = -1;
    int danger;

    char target_ring_desc[80];

    borg_item *item;

    bool fix = false;

    /* Start with current power */
    b_p = borg.power;

    /*  hack to prevent the swap till you drop loop */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* We need an empty slot to simulate pushing equipment */
    hole = borg_first_empty_inventory_slot();
    if (hole == -1)
        return false;

    /* Forbid if been sitting on level forever */
    /*    Just come back and work through the loop later */
    if (borg_t - borg_began > 2000)
        return false;
    if (borg.time_this_panel > 1300)
        return false;

    /* Scan inventory */
    for (i = 0; i < z_info->pack_size; i++) {
        item = &borg_items[i];

        /* reset this item marker */
        recently_worn = false;

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require aware */
        if (!item->aware)
            continue;

        /* Hack -- ignore "worthless" items */
        if (!item->value)
            continue;

        /* do not wear not *idd* artifacts */
        if (OPT(player, birth_randarts) && item->art_idx && !item->ident)
            continue;

        /* Do not consider wearing this item if I worn it already this level,
         * I might be stuck in a loop.
         */
        for (o = 0; o < track_worn_num; o++) {
            /* Examine the worn list */
            if (track_worn_num >= 1 && track_worn_name1[o] == item->art_idx
                && track_worn_time > borg_t - 10) {
                /* Recently worn item */
                recently_worn = true;
            }
        }

        /* Note and fail out */
        if (recently_worn == true) {
            borg_note(format(
                "# Not considering a %s; it was recently worn.", item->desc));
            continue;
        }

        /* Where does it go */
        slot = borg_wield_slot(item);

        /* Cannot wear this item */
        if (slot < 0)
            continue;

        /* Do not wear certain items if I am over weight limit.  It induces
         * loops */
        if (borg.trait[BI_ISENCUMB]) {
            /* Compare Str bonuses */
            if (borg_items[slot].modifiers[OBJ_MOD_STR]
                > item->modifiers[OBJ_MOD_STR])
                continue;
        }

        /* Obtain danger */
        danger = borg_danger(borg.c.y, borg.c.x, 1, true, false);

        /* If this is a ring and both hands are full, then check each hand
         * and compare the two.  If needed the tight ring can be removed then
         * the better ring placed there on.
         */

        /*** Process regular items and non full rings ***/

        /* Non ring, non full hands */
        if (slot != INVEN_LEFT
            || (!borg_items[INVEN_LEFT].iqty
                || !borg_items[INVEN_RIGHT].iqty)) {
            /* Take off old item */
            memcpy(&borg_items[hole], &safe_items[slot], sizeof(borg_item));

            /* Wear new item */
            memcpy(&borg_items[slot], &safe_items[i], sizeof(borg_item));

            /* Only a single item */
            borg_items[slot].iqty = 1;

            /* Reduce the inventory quantity by one */
            borg_items[i].iqty--;

            /* Fix later */
            fix = true;

            /* Examine the inventory */
            borg_notice(true);

            /* Evaluate the inventory */
            p = borg_power();

            /* Evaluate local danger */
            d = borg_danger(borg.c.y, borg.c.x, 1, true, false);

#if 0
            if (borg_cfg[BORG_VERBOSE]) {
                /* dump list and power...  for debugging */
                borg_note(format("Trying  Item %s (best power %ld)",
                    borg_items[slot].desc, (long int)p));
                borg_note(format("Against Item %s (borg_power %ld)",
                    safe_items[slot].desc, (long int)b_p));
            }
#endif

            /* Restore the old item */
            memcpy(&borg_items[slot], &safe_items[slot], sizeof(borg_item));

            /* Restore the new item */
            memcpy(&borg_items[i], &safe_items[i], sizeof(borg_item));

            /* Restore the hole */
            borg_items[hole].iqty = 0;

            /* Need to be careful not to put the One Ring onto
             * the Left Hand
             */
            if (item->one_ring && !borg_items[INVEN_LEFT].tval)
                p = -99999;

            /* Ignore if more dangerous */
            if (danger < d)
                continue;

            /* XXX XXX XXX Consider if slot is empty */

            /* Hack -- Ignore "essentially equal" swaps */
            if (p <= b_p + 50)
                continue;

            /* Maintain the "best" */
            b_i = i;
            b_p = p;
        } /* non-rings, non full */

        if (randint0(100) == 10 || item->one_ring) {
            /* ring, full hands */
            if (slot == INVEN_LEFT && borg_items[INVEN_LEFT].iqty
                && borg_items[INVEN_RIGHT].iqty) {
                for (ii = INVEN_RIGHT; ii <= INVEN_LEFT; ii++) {
                    slot = ii;

                    /* Does One Ring need to be handled here? */

                    /* Take off old item */
                    memcpy(&borg_items[hole], &safe_items[slot],
                        sizeof(borg_item));

                    /* Wear new item */
                    memcpy(
                        &borg_items[slot], &safe_items[i], sizeof(borg_item));

                    /* Only a single item */
                    borg_items[slot].iqty = 1;

                    /* Reduce the inventory quantity by one */
                    borg_items[i].iqty--;

                    /* Fix later */
                    fix = true;

                    /* Examine the inventory */
                    borg_notice(true);

                    /* Evaluate the inventory */
                    p = borg_power();

                    /* Evaluate local danger */
                    d = borg_danger(borg.c.y, borg.c.x, 1, true, false);

                    /* Restore the old item */
                    memcpy(&borg_items[slot], &safe_items[slot],
                        sizeof(borg_item));

                    /* Restore the new item */
                    memcpy(&borg_items[i], &safe_items[i], sizeof(borg_item));

                    /* Restore the hole */
                    borg_items[hole].iqty = 0;

                    /* Need to be careful not to put the One Ring onto
                     * the Left Hand
                     */
                    if (ii == INVEN_LEFT && item->one_ring)
                        p = -99999;

                    /* Ignore "bad" swaps */
                    if (p < b_p)
                        continue;

                    /* no swapping into more danger */
                    if (danger <= d && danger != 0)
                        continue;

                    /* Maintain the "best" */
                    b_i  = i;
                    b_p  = p;
                    b_ii = ii;
                }
            } /* ring, looking at replacing each ring */
        } /* Random ring check */

    } /* end scanning inventory */

    /* Restore bonuses */
    if (fix)
        borg_notice(true);

    /* item */
    if ((b_i >= 0) && (b_p > borg.power)) {
        /* Get the item */
        item = &borg_items[b_i];

        /* Define the desc of the nice ring */
        my_strcpy(target_ring_desc, item->desc, sizeof(target_ring_desc));

        /* Remove old ring to make room for good one */
        if (b_ii >= INVEN_RIGHT && item->tval == TV_RING) {
            /* Log */
            borg_note(format("# Removing %s to make room for %s.",
                borg_items[b_ii].desc, item->desc));

            /* Make room */
            borg_keypress('t');
            borg_keypress(all_letters_nohjkl[b_ii - INVEN_WIELD]);

            /* Did something */
            borg.time_this_panel++;
            return true;
        }

        /* Log */
        borg_note(format("# Wearing %s.", item->desc));

        /* Wear it */
        borg_keypress('w');
        borg_keypress(all_letters_nohjkl[b_i]);
        borg.time_this_panel++;

        /* Track the newly worn artifact item to avoid loops */
        if (item->art_idx && (track_worn_num < track_worn_size)) {
            borg_note("# Noting the wearing of artifact.");
            track_worn_name1[track_worn_num] = item->art_idx;
            track_worn_time                  = borg_t;
            track_worn_num++;
        }
        return true;
    }

    /* Nope */
    return false;
}